

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_1::GetExtractInsertValueType
          (ValidationState_t *_,Instruction *inst,uint32_t *member_type)

{
  ushort uVar1;
  pointer puVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint32_t uVar5;
  int32_t iVar6;
  DiagnosticStream *pDVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint64_t array_size;
  char *local_220;
  uint32_t *local_218;
  ulong local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  local_218 = member_type;
  if (1 < uVar1 - 0x51) {
    __assert_fail("opcode == spv::Op::OpCompositeExtract || opcode == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                  ,0x28,
                  "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                 );
  }
  uVar15 = uVar1 == 0x51 ^ 5;
  puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (ulong)((long)(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2) >> 2;
  uVar12 = (uint)uVar13;
  if (uVar12 == uVar15) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Expected at least one index to Op",0x21);
    local_220 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_220);
    pcVar11 = ", zero found";
    lVar10 = 0xc;
  }
  else {
    if (uVar12 - uVar15 < 0x100) {
      uVar14 = (ulong)uVar15;
      uVar5 = ValidationState_t::GetTypeId(_,puVar2[uVar14 - 1]);
      puVar3 = local_218;
      *local_218 = uVar5;
      if (uVar5 != 0) {
        if (uVar12 <= uVar15) {
          return SPV_SUCCESS;
        }
        local_210 = uVar13 & 0xffffffff;
        do {
          uVar12 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14];
          pIVar8 = ValidationState_t::FindDef(_,*puVar3);
          if (pIVar8 == (Instruction *)0x0) {
            __assert_fail("type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x44,
                          "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                         );
          }
          uVar1 = (pIVar8->inst_).opcode;
          if (0x1167 < uVar1) {
            if (uVar1 < 0x14a8) {
              if ((uVar1 == 0x1168) || (uVar1 == 0x13d4)) {
switchD_00616e50_caseD_1d:
                *puVar3 = (pIVar8->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[2];
                goto LAB_00616ea2;
              }
            }
            else if ((uVar1 == 0x14a8) || (uVar1 == 0x14ee)) goto switchD_00616e50_caseD_1d;
switchD_00616e50_caseD_19:
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar11 = "Reached non-composite type while indexes still remain to be traversed.";
            lVar10 = 0x46;
            goto LAB_00616fb1;
          }
          switch(uVar1) {
          case 0x17:
            puVar2 = (pIVar8->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *puVar3 = puVar2[2];
            if (puVar2[3] <= uVar12) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Vector access is out of bounds, vector size is ",
                         0x2f);
LAB_00616fff:
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar11 = ", but access index is ";
              lVar10 = 0x16;
LAB_0061710b:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar11,lVar10);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              goto LAB_00616dba;
            }
            break;
          case 0x18:
            puVar2 = (pIVar8->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *puVar3 = puVar2[2];
            if (puVar2[3] <= uVar12) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Matrix access is out of bounds, matrix has ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar11 = " columns, but access index is ";
              lVar10 = 0x1e;
              goto LAB_0061710b;
            }
            break;
          default:
            goto switchD_00616e50_caseD_19;
          case 0x1c:
            local_220 = (char *)0x0;
            pIVar9 = ValidationState_t::FindDef
                               (_,(pIVar8->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[3]);
            *puVar3 = (pIVar8->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
            iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar9->inst_).opcode);
            if (iVar6 == 0) {
              bVar4 = ValidationState_t::EvalConstantValUint64
                                (_,(pIVar8->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[3],
                                 (uint64_t *)&local_220);
              if (!bVar4) {
                __assert_fail("0 && \"Array type definition is corrupt\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                              ,100,
                              "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                             );
              }
              if (local_220 <= (char *)(ulong)uVar12) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Array access is out of bounds, array size is ",
                           0x2d);
                goto LAB_00616fff;
              }
            }
            break;
          case 0x1d:
            goto switchD_00616e50_caseD_1d;
          case 0x1e:
            puVar2 = (pIVar8->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((char *)(((long)(pIVar8->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) - 2U)
                <= (char *)(ulong)uVar12) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Index is out of bounds, can not find index ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," in the structure <id> \'",0x18);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"\'. This structure has ",0x16);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," members. Largest valid index is ",0x21);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
              goto LAB_00616dba;
            }
            *puVar3 = puVar2[uVar12 + 2];
          }
LAB_00616ea2:
          uVar14 = uVar14 + 1;
          if (local_210 == uVar14) {
            return SPV_SUCCESS;
          }
        } while( true );
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar11 = "Expected Composite to be an object of composite type";
      lVar10 = 0x34;
LAB_00616fb1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar11,lVar10);
      goto LAB_00616dba;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The number of indexes in Op",0x1b);
    local_220 = spvOpcodeString((uint)uVar1);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," may not exceed ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,". Found ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar7);
    pcVar11 = " indexes.";
    lVar10 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,pcVar11,lVar10);
  local_208.error_ = pDVar7->error_;
LAB_00616dba:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t GetExtractInsertValueType(ValidationState_t& _,
                                       const Instruction* inst,
                                       uint32_t* member_type) {
  const spv::Op opcode = inst->opcode();
  assert(opcode == spv::Op::OpCompositeExtract ||
         opcode == spv::Op::OpCompositeInsert);
  uint32_t word_index = opcode == spv::Op::OpCompositeExtract ? 4 : 5;
  const uint32_t num_words = static_cast<uint32_t>(inst->words().size());
  const uint32_t composite_id_index = word_index - 1;
  const uint32_t num_indices = num_words - word_index;
  const uint32_t kCompositeExtractInsertMaxNumIndices = 255;

  if (num_indices == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected at least one index to Op"
           << spvOpcodeString(inst->opcode()) << ", zero found";

  } else if (num_indices > kCompositeExtractInsertMaxNumIndices) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The number of indexes in Op" << spvOpcodeString(opcode)
           << " may not exceed " << kCompositeExtractInsertMaxNumIndices
           << ". Found " << num_indices << " indexes.";
  }

  *member_type = _.GetTypeId(inst->word(composite_id_index));
  if (*member_type == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Composite to be an object of composite type";
  }

  for (; word_index < num_words; ++word_index) {
    const uint32_t component_index = inst->word(word_index);
    const Instruction* const type_inst = _.FindDef(*member_type);
    assert(type_inst);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeVector: {
        *member_type = type_inst->word(2);
        const uint32_t vector_size = type_inst->word(3);
        if (component_index >= vector_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Vector access is out of bounds, vector size is "
                 << vector_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeMatrix: {
        *member_type = type_inst->word(2);
        const uint32_t num_cols = type_inst->word(3);
        if (component_index >= num_cols) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Matrix access is out of bounds, matrix has " << num_cols
                 << " columns, but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeArray: {
        uint64_t array_size = 0;
        auto size = _.FindDef(type_inst->word(3));
        *member_type = type_inst->word(2);
        if (spvOpcodeIsSpecConstant(size->opcode())) {
          // Cannot verify against the size of this array.
          break;
        }

        if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
          assert(0 && "Array type definition is corrupt");
        }
        if (component_index >= array_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Array access is out of bounds, array size is "
                 << array_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX: {
        *member_type = type_inst->word(2);
        // Array size is unknown.
        break;
      }
      case spv::Op::OpTypeStruct: {
        const size_t num_struct_members = type_inst->words().size() - 2;
        if (component_index >= num_struct_members) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Index is out of bounds, can not find index "
                 << component_index << " in the structure <id> '"
                 << type_inst->id() << "'. This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        *member_type = type_inst->word(component_index + 2);
        break;
      }
      case spv::Op::OpTypeCooperativeVectorNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeMatrixNV: {
        *member_type = type_inst->word(2);
        break;
      }
      default:
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Reached non-composite type while indexes still remain to "
                  "be traversed.";
    }
  }

  return SPV_SUCCESS;
}